

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arg.h
# Opt level: O3

string * __thiscall TCLAP::Arg::getDescription_abi_cxx11_(string *__return_storage_ptr__,Arg *this)

{
  long *plVar1;
  long *plVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  long *local_48;
  long local_40;
  long local_38;
  long lStack_30;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  if (this->_required == true) {
    std::operator+(&local_68,"(",&this->_requireLabel);
    plVar1 = (long *)std::__cxx11::string::append((char *)&local_68);
    plVar2 = plVar1 + 2;
    if ((long *)*plVar1 == plVar2) {
      local_38 = *plVar2;
      lStack_30 = plVar1[3];
      local_48 = &local_38;
    }
    else {
      local_38 = *plVar2;
      local_48 = (long *)*plVar1;
    }
    local_40 = plVar1[1];
    *plVar1 = (long)plVar2;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_48);
    if (local_48 != &local_38) {
      operator_delete(local_48);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p);
    }
  }
  std::__cxx11::string::_M_append
            ((char *)__return_storage_ptr__,(ulong)(this->_description)._M_dataplus._M_p);
  return __return_storage_ptr__;
}

Assistant:

inline std::string Arg::getDescription() const
{
	std::string desc = "";
	if ( _required )
		desc = "(" + _requireLabel + ")  ";

//	if ( _valueRequired )
//		desc += "(value required)  ";

	desc += _description;
	return desc;
}